

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

_Bool Open_JTalk_load(Open_JTalk *open_jtalk,char *dn_mecab,char *fn_voice)

{
  HTS_Boolean HVar1;
  int iVar2;
  char *__s1;
  long in_RDI;
  _Bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    iVar2 = Mecab_load(&open_jtalk->mecab,dn_mecab);
    if (iVar2 == 1) {
      HVar1 = HTS_Engine_load((HTS_Engine *)open_jtalk,(char **)dn_mecab,(size_t)fn_voice);
      if (HVar1 == '\x01') {
        __s1 = HTS_Engine_get_fullcontext_label_format((HTS_Engine *)0x19dc39);
        iVar2 = strcmp(__s1,"HTS_TTS_JPN");
        if (iVar2 == 0) {
          local_1 = true;
        }
        else {
          Open_JTalk_clear((Open_JTalk *)0x19dc57);
          local_1 = false;
        }
      }
      else {
        Open_JTalk_clear((Open_JTalk *)0x19dc24);
        local_1 = false;
      }
    }
    else {
      Open_JTalk_clear((Open_JTalk *)0x19dbf3);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Open_JTalk_load(Open_JTalk *open_jtalk, char *dn_mecab, char *fn_voice)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	if (Mecab_load(&open_jtalk->mecab, dn_mecab) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	if (HTS_Engine_load(&open_jtalk->engine, &fn_voice, 1) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	if (strcmp(HTS_Engine_get_fullcontext_label_format(&open_jtalk->engine), "HTS_TTS_JPN") != 0)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	return true;
}